

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O1

bool crnlib::create_texture_mipmaps
               (mipmapped_texture *work_tex,crn_comp_params *params,crn_mipmap_params *mipmap_params
               ,bool generate_mipmaps)

{
  crn_mip_mode cVar1;
  crn_bool cVar2;
  vector<crnlib::mip_level_*> *pvVar3;
  undefined7 in_register_00000009;
  uint uVar4;
  uint uVar5;
  uint height;
  ulong uVar6;
  char *p;
  uint width;
  bool bVar7;
  int new_height;
  int new_width;
  int uheight;
  int uwidth;
  int lheight;
  int lwidth;
  uint local_88;
  uint local_84;
  undefined4 local_80;
  undefined4 local_7c;
  crn_comp_params *local_78;
  uint local_70;
  uint local_6c;
  timer local_68;
  generate_mipmap_params local_50;
  
  local_7c = (undefined4)CONCAT71(in_register_00000009,generate_mipmaps);
  cVar1 = mipmap_params->m_mode;
  local_78 = params;
  if (cVar1 == cCRNMipModeNoMips) {
    local_80 = 1;
    mipmapped_texture::discard_mipmaps(work_tex);
  }
  else if (cVar1 == cCRNMipModeGenerateMips) {
    local_80 = 0;
  }
  else {
    local_80 = (undefined4)CONCAT71(in_register_00000009,1);
    if ((cVar1 == cCRNMipModeUseSourceOrGenerateMips) && ((work_tex->m_faces).m_size != 0)) {
      pvVar3 = (work_tex->m_faces).m_p;
      local_80 = (undefined4)CONCAT71((int7)((ulong)pvVar3 >> 8),pvVar3->m_size != 1);
    }
  }
  uVar5 = mipmap_params->m_window_left;
  uVar4 = mipmap_params->m_window_top;
  width = mipmap_params->m_window_right - uVar5;
  height = mipmap_params->m_window_bottom - uVar4;
  if ((height != 0 && (int)uVar4 <= (int)mipmap_params->m_window_bottom) &&
      (width != 0 && (int)uVar5 <= (int)mipmap_params->m_window_right)) {
    if ((work_tex->m_faces).m_size < 2) {
      console::info("Cropping input texture from window (%ux%u)-(%ux%u)",(ulong)uVar5,(ulong)uVar4);
      bVar7 = mipmapped_texture::crop(work_tex,uVar5,uVar4,width,height);
      if (bVar7) goto LAB_0014766b;
      p = "Failed cropping window rect";
    }
    else {
      p = "Can\'t crop cubemap textures";
    }
    console::warning(p);
  }
LAB_0014766b:
  local_84 = work_tex->m_width;
  local_88 = work_tex->m_height;
  uVar5 = mipmap_params->m_clamp_width;
  if ((((uVar5 != 0) && (uVar4 = mipmap_params->m_clamp_height, uVar4 != 0)) &&
      ((int)uVar5 < (int)local_84 || (int)uVar4 < (int)local_88)) &&
     (mipmap_params->m_clamp_scale == 0)) {
    if ((work_tex->m_faces).m_size < 2) {
      if (uVar5 < local_84) {
        local_84 = uVar5;
      }
      if (uVar4 < local_88) {
        local_88 = uVar4;
      }
      console::info("Clamping input texture to %ux%u");
      mipmapped_texture::crop(work_tex,0,0,local_84,local_88);
    }
    else {
      console::warning("Can\'t crop cubemap textures");
    }
  }
  if (mipmap_params->m_scale_mode != cCRNSMDisabled) {
    if ((local_84 - 1 < (local_84 ^ local_84 - 1)) && (local_88 != 0)) {
      bVar7 = (local_88 & local_88 - 1) == 0;
    }
    else {
      bVar7 = false;
    }
    switch(mipmap_params->m_scale_mode) {
    case cCRNSMAbsolute:
      local_84 = (uint)(long)mipmap_params->m_scale_x;
      local_88 = (uint)(long)mipmap_params->m_scale_y;
      break;
    case cCRNSMRelative:
      local_84 = (uint)(long)((float)(int)local_84 * mipmap_params->m_scale_x + 0.5);
      local_88 = (uint)(long)((float)(int)local_88 * mipmap_params->m_scale_y + 0.5);
      break;
    case cCRNSMLowerPow2:
      if (!bVar7) {
        math::compute_lower_pow2_dim((int *)&local_84,(int *)&local_88);
      }
      break;
    case cCRNSMNearestPow2:
      if (!bVar7) {
        local_50.super_resample_params.m_pFilter =
             (char *)CONCAT44(local_50.super_resample_params.m_pFilter._4_4_,local_84);
        local_68.m_start_time._0_4_ = local_88;
        math::compute_lower_pow2_dim((int *)&local_50,(int *)&local_68);
        local_6c = local_84;
        local_70 = local_88;
        math::compute_upper_pow2_dim((int *)&local_6c,(int *)&local_70);
        uVar4 = local_84 - (uint)local_50.super_resample_params.m_pFilter;
        uVar5 = -uVar4;
        if (0 < (int)uVar4) {
          uVar5 = uVar4;
        }
        local_84 = local_84 - local_6c;
        uVar4 = -local_84;
        if (0 < (int)local_84) {
          uVar4 = local_84;
        }
        local_84 = local_6c;
        if (uVar5 < uVar4) {
          local_84 = (uint)local_50.super_resample_params.m_pFilter;
        }
        uVar4 = local_88 - (uint)local_68.m_start_time;
        uVar5 = -uVar4;
        if (0 < (int)uVar4) {
          uVar5 = uVar4;
        }
        local_88 = local_88 - local_70;
        uVar4 = -local_88;
        if (0 < (int)local_88) {
          uVar4 = local_88;
        }
        local_88 = local_70;
        if (uVar5 < uVar4) {
          local_88 = (uint)local_68.m_start_time;
        }
      }
      break;
    case cCRNSMNextPow2:
      if (!bVar7) {
        math::compute_upper_pow2_dim((int *)&local_84,(int *)&local_88);
      }
    }
  }
  uVar5 = mipmap_params->m_clamp_width;
  if (((uVar5 != 0) && (uVar4 = mipmap_params->m_clamp_height, uVar4 != 0)) &&
     (((int)uVar5 < (int)local_84 || (int)uVar4 < (int)local_88 &&
      (mipmap_params->m_clamp_scale != 0)))) {
    if (uVar5 < local_84) {
      local_84 = uVar5;
    }
    if (uVar4 < local_88) {
      local_88 = uVar4;
    }
  }
  if (0xfff < (int)local_84) {
    local_84 = 0x1000;
  }
  if ((int)local_84 < 2) {
    local_84 = 1;
  }
  uVar5 = 0x1000;
  if ((int)local_88 < 0x1000) {
    uVar5 = local_88;
  }
  local_88 = uVar5;
  if ((int)uVar5 < 2) {
    local_88 = 1;
  }
  if (((local_84 != work_tex->m_width) || (local_88 != work_tex->m_height)) ||
     ((mipmap_params->m_renormalize == 1 && (mipmap_params->m_rtopmip == 1)))) {
    console::info("Resampling input texture to %ux%u");
    local_50.super_resample_params.m_pFilter = crn_get_mip_filter_name(mipmap_params->m_filter);
    local_50.super_resample_params.m_rtopmip = false;
    local_50.super_resample_params.m_wrapping =
         (work_tex->m_faces).m_size == 0 && mipmap_params->m_tiled != 0;
    local_50.super_resample_params.m_renormalize = mipmap_params->m_renormalize != 0;
    local_50.super_resample_params.m_srgb = mipmap_params->m_gamma_filtering != 0;
    local_50.super_resample_params.m_filter_scale = 1.0;
    local_50.super_resample_params.m_gamma = mipmap_params->m_gamma;
    local_50.super_resample_params.m_multithreaded = local_78->m_num_helper_threads != 0;
    bVar7 = mipmapped_texture::resize(work_tex,local_84,local_88,&local_50.super_resample_params);
    if (!bVar7) {
      console::error("Failed resizing texture!");
      return false;
    }
  }
  if ((char)local_80 == '\0' && (char)local_7c == '\x01') {
    cVar2 = mipmap_params->m_gamma_filtering;
    local_50.super_resample_params.m_pFilter = crn_get_mip_filter_name(mipmap_params->m_filter);
    local_50.super_resample_params.m_rtopmip = false;
    local_50.super_resample_params.m_wrapping = mipmap_params->m_tiled != 0;
    local_50.super_resample_params.m_renormalize = mipmap_params->m_renormalize != 0;
    local_50.super_resample_params.m_srgb = cVar2 != 0;
    local_50.super_resample_params.m_filter_scale = mipmap_params->m_blurriness;
    local_50.super_resample_params.m_gamma = mipmap_params->m_gamma;
    local_50.super_resample_params.m_multithreaded = local_78->m_num_helper_threads != 0;
    local_50.m_max_mips = mipmap_params->m_max_levels;
    local_50.m_min_mip_size = mipmap_params->m_min_mip_size;
    console::info("Generating mipmaps using filter \"%s\"",local_50.super_resample_params.m_pFilter)
    ;
    timer::timer(&local_68);
    timer::start(&local_68);
    bVar7 = mipmapped_texture::generate_mipmaps(work_tex,&local_50,true);
    if (bVar7) {
      timer::get_elapsed_secs(&local_68);
      if ((work_tex->m_faces).m_size == 0) {
        uVar6 = 0xffffffff;
      }
      else {
        uVar6 = (ulong)(((work_tex->m_faces).m_p)->m_size - 1);
      }
      console::info("Generated %u mipmap levels in %3.3fs",uVar6);
    }
    else {
      console::error("Failed generating mipmaps!");
    }
    if (!bVar7) {
      return false;
    }
  }
  return true;
}

Assistant:

bool create_texture_mipmaps(mipmapped_texture& work_tex, const crn_comp_params& params, const crn_mipmap_params& mipmap_params, bool generate_mipmaps)
    {
        crn_comp_params new_params(params);

        bool generate_new_mips = false;

        switch (mipmap_params.m_mode)
        {
        case cCRNMipModeUseSourceOrGenerateMips:
        {
            if (work_tex.get_num_levels() == 1)
            {
                generate_new_mips = true;
            }
            break;
        }
        case cCRNMipModeUseSourceMips:
        {
            break;
        }
        case cCRNMipModeGenerateMips:
        {
            generate_new_mips = true;
            break;
        }
        case cCRNMipModeNoMips:
        {
            work_tex.discard_mipmaps();
            break;
        }
        default:
        {
            CRNLIB_ASSERT(0);
            break;
        }
        }

        rect window_rect(mipmap_params.m_window_left, mipmap_params.m_window_top, mipmap_params.m_window_right, mipmap_params.m_window_bottom);

        if (!window_rect.is_empty())
        {
            if (work_tex.get_num_faces() > 1)
            {
                console::warning("Can't crop cubemap textures");
            }
            else
            {
                console::info("Cropping input texture from window (%ux%u)-(%ux%u)", window_rect.get_left(), window_rect.get_top(), window_rect.get_right(), window_rect.get_bottom());

                if (!work_tex.crop(window_rect.get_left(), window_rect.get_top(), window_rect.get_width(), window_rect.get_height()))
                {
                    console::warning("Failed cropping window rect");
                }
            }
        }

        int new_width = work_tex.get_width();
        int new_height = work_tex.get_height();

        if ((mipmap_params.m_clamp_width) && (mipmap_params.m_clamp_height))
        {
            if ((new_width > (int)mipmap_params.m_clamp_width) || (new_height > (int)mipmap_params.m_clamp_height))
            {
                if (!mipmap_params.m_clamp_scale)
                {
                    if (work_tex.get_num_faces() > 1)
                    {
                        console::warning("Can't crop cubemap textures");
                    }
                    else
                    {
                        new_width = math::minimum<uint>(mipmap_params.m_clamp_width, new_width);
                        new_height = math::minimum<uint>(mipmap_params.m_clamp_height, new_height);
                        console::info("Clamping input texture to %ux%u", new_width, new_height);
                        work_tex.crop(0, 0, new_width, new_height);
                    }
                }
            }
        }

        if (mipmap_params.m_scale_mode != cCRNSMDisabled)
        {
            bool is_pow2 = math::is_power_of_2((uint32)new_width) && math::is_power_of_2((uint32)new_height);

            switch (mipmap_params.m_scale_mode)
            {
            case cCRNSMAbsolute:
            {
                new_width = (uint)mipmap_params.m_scale_x;
                new_height = (uint)mipmap_params.m_scale_y;
                break;
            }
            case cCRNSMRelative:
            {
                new_width = (uint)(mipmap_params.m_scale_x * new_width + .5f);
                new_height = (uint)(mipmap_params.m_scale_y * new_height + .5f);
                break;
            }
            case cCRNSMLowerPow2:
            {
                if (!is_pow2)
                {
                    math::compute_lower_pow2_dim(new_width, new_height);
                }
                break;
            }
            case cCRNSMNearestPow2:
            {
                if (!is_pow2)
                {
                    int lwidth = new_width;
                    int lheight = new_height;
                    math::compute_lower_pow2_dim(lwidth, lheight);

                    int uwidth = new_width;
                    int uheight = new_height;
                    math::compute_upper_pow2_dim(uwidth, uheight);

                    if (labs(new_width - lwidth) < labs(new_width - uwidth))
                    {
                        new_width = lwidth;
                    }
                    else
                    {
                        new_width = uwidth;
                    }

                    if (labs(new_height - lheight) < labs(new_height - uheight))
                    {
                        new_height = lheight;
                    }
                    else
                    {
                        new_height = uheight;
                    }
                }
                break;
            }
            case cCRNSMNextPow2:
            {
                if (!is_pow2)
                {
                    math::compute_upper_pow2_dim(new_width, new_height);
                }
                break;
            }
            default:
                break;
            }
        }

        if ((mipmap_params.m_clamp_width) && (mipmap_params.m_clamp_height))
        {
            if ((new_width > (int)mipmap_params.m_clamp_width) || (new_height > (int)mipmap_params.m_clamp_height))
            {
                if (mipmap_params.m_clamp_scale)
                {
                    new_width = math::minimum<uint>(mipmap_params.m_clamp_width, new_width);
                    new_height = math::minimum<uint>(mipmap_params.m_clamp_height, new_height);
                }
            }
        }

        new_width = math::clamp<int>(new_width, 1, cCRNMaxLevelResolution);
        new_height = math::clamp<int>(new_height, 1, cCRNMaxLevelResolution);

        if ((new_width != (int)work_tex.get_width()) || (new_height != (int)work_tex.get_height()) || (mipmap_params.m_renormalize == true && mipmap_params.m_rtopmip == true))
        {
            console::info("Resampling input texture to %ux%u", new_width, new_height);

            const char* pFilter = crn_get_mip_filter_name(mipmap_params.m_filter);

            bool srgb = mipmap_params.m_gamma_filtering != 0;

            mipmapped_texture::resample_params res_params;
            res_params.m_pFilter = pFilter;
            res_params.m_wrapping = mipmap_params.m_tiled != 0;
            if (work_tex.get_num_faces())
            {
                res_params.m_wrapping = false;
            }
            res_params.m_renormalize = mipmap_params.m_renormalize != 0;
            res_params.m_filter_scale = 1.0f;
            res_params.m_gamma = mipmap_params.m_gamma;
            res_params.m_srgb = srgb;
            res_params.m_multithreaded = (params.m_num_helper_threads > 0);

            if (!work_tex.resize(new_width, new_height, res_params))
            {
                console::error("Failed resizing texture!");
                return false;
            }
        }

        if ((generate_new_mips) && (generate_mipmaps))
        {
            bool srgb = mipmap_params.m_gamma_filtering != 0;

            const char* pFilter = crn_get_mip_filter_name(mipmap_params.m_filter);

            mipmapped_texture::generate_mipmap_params gen_params;
            gen_params.m_pFilter = pFilter;
            gen_params.m_wrapping = mipmap_params.m_tiled != 0;
            gen_params.m_renormalize = mipmap_params.m_renormalize != 0;
            gen_params.m_filter_scale = mipmap_params.m_blurriness;
            gen_params.m_gamma = mipmap_params.m_gamma;
            gen_params.m_srgb = srgb;
            gen_params.m_multithreaded = params.m_num_helper_threads > 0;
            gen_params.m_max_mips = mipmap_params.m_max_levels;
            gen_params.m_min_mip_size = mipmap_params.m_min_mip_size;

            console::info("Generating mipmaps using filter \"%s\"", pFilter);

            timer tm;
            tm.start();
            if (!work_tex.generate_mipmaps(gen_params, true))
            {
                console::error("Failed generating mipmaps!");
                return false;
            }
            double t = tm.get_elapsed_secs();

            console::info("Generated %u mipmap levels in %3.3fs", work_tex.get_num_levels() - 1, t);
        }

        return true;
    }